

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O3

int ksplit_core(char *s,int delimiter,int *_max,int **_offsets)

{
  ushort uVar1;
  size_t sVar2;
  int *piVar3;
  ushort **ppuVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int local_54;
  int *local_50;
  
  local_54 = *_max;
  local_50 = *_offsets;
  sVar2 = strlen(s);
  iVar6 = 0;
  if (-1 < (int)sVar2) {
    uVar9 = 0;
    iVar6 = 0;
    uVar7 = 0;
    iVar8 = 0;
    do {
      piVar3 = local_50;
      if (delimiter == 0) {
        ppuVar4 = __ctype_b_loc();
        uVar1 = (*ppuVar4)[iVar8];
        if (((long)s[uVar9] == 0) || (((*ppuVar4)[s[uVar9]] & 0x2000) != 0)) {
          if ((short)uVar1 < 0) {
            s[uVar9] = '\0';
            if (iVar6 == local_54) {
              local_54 = iVar6 * 2;
              if (iVar6 == 0) {
                local_54 = 2;
              }
              piVar3 = (int *)realloc(local_50,(long)local_54 << 2);
              goto joined_r0x0013b6e8;
            }
            goto LAB_0013b6f6;
          }
        }
        else {
          if (iVar8 == 0) {
            uVar7 = uVar9 & 0xffffffff;
          }
          if ((uVar1 & 0x2000) != 0) {
            uVar7 = uVar9 & 0xffffffff;
          }
        }
      }
      else if (s[uVar9] == '\0' || s[uVar9] == delimiter) {
        if (iVar8 != delimiter && iVar8 != 0) {
          s[uVar9] = '\0';
          if (iVar6 == local_54) {
            local_54 = iVar6 * 2;
            if (iVar6 == 0) {
              local_54 = 2;
            }
            piVar3 = (int *)realloc(local_50,(long)local_54 << 2);
joined_r0x0013b6e8:
            if (piVar3 == (int *)0x0) {
              free(local_50);
              local_50 = (int *)0x0;
              iVar6 = 0;
              goto LAB_0013b725;
            }
          }
LAB_0013b6f6:
          lVar5 = (long)iVar6;
          iVar6 = iVar6 + 1;
          piVar3[lVar5] = (int)uVar7;
          local_50 = piVar3;
        }
      }
      else {
        if (iVar8 == 0) {
          uVar7 = uVar9 & 0xffffffff;
        }
        if (iVar8 == delimiter) {
          uVar7 = uVar9 & 0xffffffff;
        }
      }
      iVar8 = (int)s[uVar9];
      uVar9 = uVar9 + 1;
    } while ((int)sVar2 + 1 != uVar9);
  }
  *_max = local_54;
LAB_0013b725:
  *_offsets = local_50;
  return iVar6;
}

Assistant:

int ksplit_core(char *s, int delimiter, int *_max, int **_offsets)
{
	int i, n, max, last_char, last_start, *offsets, l;
	n = 0; max = *_max; offsets = *_offsets;
	l = strlen(s);
	
#define __ksplit_aux do {						\
		if (_offsets) {						\
			s[i] = 0;					\
			if (n == max) {					\
				int *tmp;				\
				max = max? max<<1 : 2;			\
				if ((tmp = (int*)realloc(offsets, sizeof(int) * max))) {  \
					offsets = tmp;			\
				} else	{				\
					free(offsets);			\
					*_offsets = NULL;		\
					return 0;			\
				}					\
			}						\
			offsets[n++] = last_start;			\
		} else ++n;						\
	} while (0)

	for (i = 0, last_char = last_start = 0; i <= l; ++i) {
		if (delimiter == 0) {
			if (isspace(s[i]) || s[i] == 0) {
				if (isgraph(last_char)) __ksplit_aux; // the end of a field
			} else {
				if (isspace(last_char) || last_char == 0) last_start = i;
			}
		} else {
			if (s[i] == delimiter || s[i] == 0) {
				if (last_char != 0 && last_char != delimiter) __ksplit_aux; // the end of a field
			} else {
				if (last_char == delimiter || last_char == 0) last_start = i;
			}
		}
		last_char = s[i];
	}
	*_max = max; *_offsets = offsets;
	return n;
}